

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedata.cpp
# Opt level: O3

QString * __thiscall QMimeData::html(QString *__return_storage_ptr__,QMimeData *this)

{
  QMimeDataPrivate *this_00;
  long in_FS_OFFSET;
  QMetaType local_58;
  QString local_50;
  anon_union_24_3_e3d07ef4_for_data local_38;
  undefined1 *puStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QMimeDataPrivate *)(this->super_QObject).d_ptr.d;
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_38.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_50.d.d = (Data *)0x0;
  local_50.d.ptr = L"text/html";
  local_50.d.size = 9;
  QMetaType::QMetaType(&local_58,10);
  QMimeDataPrivate::retrieveTypedData((QVariant *)&local_38,this_00,&local_50,local_58);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  ::QVariant::toString(__return_storage_ptr__,(QVariant *)&local_38);
  ::QVariant::~QVariant((QVariant *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QMimeData::html() const
{
    Q_D(const QMimeData);
    QVariant data = d->retrieveTypedData(textHtmlLiteral(), QMetaType(QMetaType::QString));
    return data.toString();
}